

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O2

string * __thiscall
cmFindLibraryCommand::FindNormalLibraryDirsPerName_abi_cxx11_
          (string *__return_storage_ptr__,cmFindLibraryCommand *this)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  pointer name;
  pointer path;
  cmFindLibraryHelper helper;
  allocator<char> local_1c1;
  cmFindLibraryCommand *local_1c0;
  string local_1b8;
  undefined1 local_198 [360];
  
  std::__cxx11::string::string
            ((string *)&local_1b8,(string *)&(this->super_cmFindBase).FindCommandName);
  cmFindLibraryHelper::cmFindLibraryHelper
            ((cmFindLibraryHelper *)local_198,&local_1b8,
             (this->super_cmFindBase).super_cmFindCommon.Makefile,&this->super_cmFindBase);
  std::__cxx11::string::~string((string *)&local_1b8);
  name = (this->super_cmFindBase).Names.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->super_cmFindBase).Names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1c0 = this;
  do {
    if (name == pbVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_1c1);
LAB_00220a2c:
      cmFindLibraryHelper::~cmFindLibraryHelper((cmFindLibraryHelper *)local_198);
      return __return_storage_ptr__;
    }
    cmFindLibraryHelper::SetName((cmFindLibraryHelper *)local_198,name);
    path = (local_1c0->super_cmFindBase).super_cmFindCommon.SearchPaths.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (local_1c0->super_cmFindBase).super_cmFindCommon.SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    while (path != pbVar2) {
      bVar3 = cmFindLibraryHelper::CheckDirectory((cmFindLibraryHelper *)local_198,path);
      path = path + 1;
      if (bVar3) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(local_198 + 0x88));
        goto LAB_00220a2c;
      }
    }
    name = name + 1;
  } while( true );
}

Assistant:

std::string cmFindLibraryCommand::FindNormalLibraryDirsPerName()
{
  // Search the entire path for each name.
  cmFindLibraryHelper helper(this->FindCommandName, this->Makefile, this);
  for (std::string const& n : this->Names) {
    // Switch to searching for this name.
    helper.SetName(n);

    // Search every directory.
    for (std::string const& sp : this->SearchPaths) {
      if (helper.CheckDirectory(sp)) {
        return helper.BestPath;
      }
    }
  }
  // Couldn't find the library.
  return "";
}